

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O1

int main_internal(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  undefined4 in_register_0000003c;
  dynamic_string cmd_line;
  corpus_gen generator;
  dynamic_string local_b8;
  crunch local_a8;
  
  crnlib::colorized_console::init((EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,argc));
  bVar1 = check_for_option(argc,argv,"quiet");
  if (bVar1) {
    crnlib::console::m_output_disabled = 1;
  }
  bVar1 = check_for_option(argc,argv,"noTitle");
  if (!bVar1) {
    crnlib::console::printf
              ("crunch: Advanced DXTn Texture Compressor (Daemon branch, Unity format variant)");
    crnlib::console::printf("");
    crnlib::console::printf("crnlib version v%u.%02uU %s %s",1,4,"64-bit","Built from git-73e74fa");
    crnlib::console::printf("");
    crnlib::console::printf("Crunch is brought to you by:");
    crnlib::console::printf("- 2014-2024 Daemon Developers and contributors");
    crnlib::console::printf("  https://github.com/DaemonEngine/crunch");
    crnlib::console::printf("- 2017-2018 Alexander Suvorov and Unity Software Inc.");
    crnlib::console::printf("  https://github.com/Unity-Technologies/crunch/tree/unity");
    crnlib::console::printf("- 2010-2017 Richard Geldreich, Jr. and Binomial LLC and contributors");
    crnlib::console::printf("  https://github.com/BinomialLLC/crunch");
    crnlib::console::printf("");
    crnlib::console::printf
              ("Please report bugs here: https://github.com/DaemonEngine/crunch/issues");
    crnlib::console::printf("");
  }
  local_b8.m_buf_size = 0;
  local_b8.m_len = 0;
  local_b8.m_pStr = (char *)0x0;
  crnlib::get_command_line_as_single_string(&local_b8,argc,argv);
  bVar1 = check_for_option(argc,argv,"corpus_gen");
  if (bVar1) {
    crnlib::corpus_gen::corpus_gen((corpus_gen *)&local_a8);
    pcVar2 = "";
    if (local_b8.m_pStr != (char *)0x0) {
      pcVar2 = local_b8.m_pStr;
    }
    bVar1 = crnlib::corpus_gen::generate((corpus_gen *)&local_a8,pcVar2);
  }
  else {
    bVar1 = check_for_option(argc,argv,"corpus_test");
    if (bVar1) {
      crnlib::corpus_tester::corpus_tester((corpus_tester *)&local_a8);
      pcVar2 = "";
      if (local_b8.m_pStr != (char *)0x0) {
        pcVar2 = local_b8.m_pStr;
      }
      bVar1 = crnlib::corpus_tester::test((corpus_tester *)&local_a8,pcVar2);
      if (local_a8.m_log_stream.m_pFile != (FILE *)0x0) {
        crnlib::crnlib_free(local_a8.m_log_stream.m_pFile);
      }
    }
    else {
      crunch::crunch(&local_a8);
      pcVar2 = "";
      if (local_b8.m_pStr != (char *)0x0) {
        pcVar2 = local_b8.m_pStr;
      }
      bVar1 = crunch::convert(&local_a8,pcVar2);
      crunch::~crunch(&local_a8);
    }
  }
  crnlib::colorized_console::deinit();
  crnlib::crnlib_print_mem_stats();
  if ((local_b8.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_b8.m_pStr + -8) ^ *(uint *)(local_b8.m_pStr + -4)) == 0xffffffff)) {
    crnlib::crnlib_free(local_b8.m_pStr + -0x10);
  }
  return (int)(bVar1 ^ 1);
}

Assistant:

static int main_internal(int argc, char* argv[]) {
  colorized_console::init();

  if (check_for_option(argc, argv, "quiet"))
    console::disable_output();

  if (!check_for_option(argc, argv, "noTitle"))
    print_title();

  dynamic_string cmd_line;
  get_command_line_as_single_string(cmd_line, argc, argv);

  bool status = false;
  if (check_for_option(argc, argv, "corpus_gen")) {
    corpus_gen generator;
    status = generator.generate(cmd_line.get_ptr());
  } else if (check_for_option(argc, argv, "corpus_test")) {
    corpus_tester tester;
    status = tester.test(cmd_line.get_ptr());
  } else {
    crunch converter;
    status = converter.convert(cmd_line.get_ptr());
  }

  colorized_console::deinit();

  crnlib_print_mem_stats();

  return status ? EXIT_SUCCESS : EXIT_FAILURE;
}